

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hbtrie.cc
# Opt level: O1

hbtrie_result hbtrie_next_value_only(hbtrie_iterator *it,void *value_buf)

{
  list_elem *plVar1;
  hbtrie_result hVar2;
  btreeit_item *item;
  
  if (it->curkey == (void *)0x0) {
    hVar2 = HBTRIE_RESULT_FAIL;
  }
  else {
    plVar1 = (it->btreeit_list).head;
    item = (btreeit_item *)(plVar1 + -7);
    if (plVar1 == (list_elem *)0x0) {
      item = (btreeit_item *)0x0;
    }
    hVar2 = _hbtrie_next(it,item,(void *)0x0,(size_t *)0x0,value_buf,'\x01');
    if (hVar2 != HBTRIE_RESULT_SUCCESS) {
      free(it->curkey);
      it->curkey = (void *)0x0;
    }
  }
  return hVar2;
}

Assistant:

hbtrie_result hbtrie_next_value_only(struct hbtrie_iterator *it,
                                     void *value_buf)
{
    hbtrie_result hr;

    if (it->curkey == NULL) return HBTRIE_RESULT_FAIL;

    struct list_elem *e = list_begin(&it->btreeit_list);
    struct btreeit_item *item = NULL;
    if (e) item = _get_entry(e, struct btreeit_item, le);

    hr = _hbtrie_next(it, item, NULL, 0, value_buf, HBTRIE_PREFIX_MATCH_ONLY);
    if (hr != HBTRIE_RESULT_SUCCESS) {
        // this iterator reaches the end of hb-trie
        free(it->curkey);
        it->curkey = NULL;
    }
    return hr;
}